

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::IfcStructuralConnection
          (IfcStructuralConnection *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralConnection *this_local;
  
  IfcStructuralItem::IfcStructuralItem((IfcStructuralItem *)this,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>,
             vtt + 0x1f);
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x21];
  *(void **)&this->field_0x88 = vtt[0x22];
  *(void **)&this->field_0x98 = vtt[0x23];
  *(void **)&this->field_0xd0 = vtt[0x24];
  *(void **)&this->field_0x100 = vtt[0x25];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x26];
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}